

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswSweep.c
# Opt level: O3

int Ssw_ManSweepBmc(Ssw_Man_t *p)

{
  void *pvVar1;
  int iVar2;
  Aig_Man_t *pAVar3;
  Bar_Progress_t *p_00;
  Aig_Obj_t *pAVar4;
  ulong uVar5;
  uint uVar6;
  Vec_Ptr_t *pVVar7;
  Ssw_Pars_t *pSVar8;
  long lVar9;
  Aig_Obj_t *p1;
  int iVar10;
  uint uVar11;
  Aig_Obj_t *pAVar12;
  int iVar13;
  long lVar14;
  timespec ts;
  timespec local_40;
  
  iVar2 = clock_gettime(3,&local_40);
  if (iVar2 < 0) {
    lVar9 = 1;
  }
  else {
    lVar9 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_40.tv_nsec),8);
    lVar9 = ((lVar9 >> 7) - (lVar9 >> 0x3f)) + local_40.tv_sec * -1000000;
  }
  pAVar3 = Aig_ManStart(p->pPars->nFramesK * p->pAig->vObjs->nSize);
  p->pFrames = pAVar3;
  pAVar3 = p->pAig;
  if (0 < pAVar3->nRegs) {
    iVar2 = 0;
    do {
      uVar6 = pAVar3->nTruePis + iVar2;
      if (((int)uVar6 < 0) || (pAVar3->vCis->nSize <= (int)uVar6)) {
LAB_006b5046:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      p->pNodeToFrames[(long)*(int *)((long)pAVar3->vCis->pArray[uVar6] + 0x24) * (long)p->nFrames]
           = (Aig_Obj_t *)((ulong)p->pFrames->pConst1 ^ 1);
      iVar2 = iVar2 + 1;
      pAVar3 = p->pAig;
    } while (iVar2 < pAVar3->nRegs);
  }
  p->fRefined = 0;
  pSVar8 = p->pPars;
  if (pSVar8->fVerbose == 0) {
    p_00 = (Bar_Progress_t *)0x0;
  }
  else {
    p_00 = Bar_ProgressStart(_stdout,pSVar8->nFramesK * pAVar3->vObjs->nSize);
    pSVar8 = p->pPars;
  }
  if (0 < pSVar8->nFramesK) {
    pAVar3 = p->pAig;
    iVar2 = 0;
    do {
      p->pNodeToFrames[pAVar3->pConst1->Id * p->nFrames + iVar2] = p->pFrames->pConst1;
      pAVar3 = p->pAig;
      if (0 < pAVar3->nTruePis) {
        lVar14 = 0;
        do {
          if (pAVar3->vCis->nSize <= lVar14) goto LAB_006b5046;
          pvVar1 = pAVar3->vCis->pArray[lVar14];
          pAVar4 = Aig_ObjCreateCi(p->pFrames);
          p->pNodeToFrames[*(int *)((long)pvVar1 + 0x24) * p->nFrames + iVar2] = pAVar4;
          lVar14 = lVar14 + 1;
          pAVar3 = p->pAig;
        } while (lVar14 < pAVar3->nTruePis);
      }
      if (0 < pAVar3->nRegs) {
        iVar10 = 0;
        do {
          uVar6 = pAVar3->nTruePis + iVar10;
          if (((int)uVar6 < 0) || (pAVar3->vCis->nSize <= (int)uVar6)) goto LAB_006b5046;
          uVar6 = Ssw_ManSweepNode(p,(Aig_Obj_t *)pAVar3->vCis->pArray[uVar6],iVar2,1,
                                   (Vec_Int_t *)0x0);
          p->fRefined = p->fRefined | uVar6;
          iVar10 = iVar10 + 1;
          pAVar3 = p->pAig;
        } while (iVar10 < pAVar3->nRegs);
      }
      pVVar7 = pAVar3->vObjs;
      uVar5 = (ulong)(uint)pVVar7->nSize;
      if (0 < pVVar7->nSize) {
        lVar14 = 0;
        do {
          pAVar4 = (Aig_Obj_t *)pVVar7->pArray[lVar14];
          if ((pAVar4 != (Aig_Obj_t *)0x0) && (0xfffffffd < (*(uint *)&pAVar4->field_0x18 & 7) - 7))
          {
            if ((p->pPars->fVerbose != 0) &&
               ((iVar10 = (int)uVar5 * iVar2 + (int)lVar14, p_00 == (Bar_Progress_t *)0x0 ||
                (p_00->nItemsNext <= iVar10)))) {
              Bar_ProgressUpdate_int(p_00,iVar10,(char *)0x0);
            }
            if (((ulong)pAVar4 & 1) != 0) goto LAB_006b5065;
            uVar5 = (ulong)pAVar4->pFanin0 & 0xfffffffffffffffe;
            if (uVar5 == 0) {
              pAVar12 = (Aig_Obj_t *)0x0;
            }
            else {
              pAVar12 = (Aig_Obj_t *)
                        ((ulong)((uint)pAVar4->pFanin0 & 1) ^
                        (ulong)p->pNodeToFrames[*(int *)(uVar5 + 0x24) * p->nFrames + iVar2]);
            }
            uVar5 = (ulong)pAVar4->pFanin1 & 0xfffffffffffffffe;
            if (uVar5 == 0) {
              p1 = (Aig_Obj_t *)0x0;
            }
            else {
              p1 = (Aig_Obj_t *)
                   ((ulong)((uint)pAVar4->pFanin1 & 1) ^
                   (ulong)p->pNodeToFrames[*(int *)(uVar5 + 0x24) * p->nFrames + iVar2]);
            }
            pAVar12 = Aig_And(p->pFrames,pAVar12,p1);
            p->pNodeToFrames[pAVar4->Id * p->nFrames + iVar2] = pAVar12;
            uVar6 = Ssw_ManSweepNode(p,pAVar4,iVar2,1,(Vec_Int_t *)0x0);
            p->fRefined = p->fRefined | uVar6;
            pAVar3 = p->pAig;
          }
          lVar14 = lVar14 + 1;
          pVVar7 = pAVar3->vObjs;
          uVar5 = (ulong)pVVar7->nSize;
        } while (lVar14 < (long)uVar5);
      }
      pSVar8 = p->pPars;
      if (iVar2 == pSVar8->nFramesK + -1) break;
      pVVar7 = pAVar3->vCos;
      if (0 < pVVar7->nSize) {
        lVar14 = 0;
        do {
          pvVar1 = pVVar7->pArray[lVar14];
          if (((ulong)pvVar1 & 1) != 0) {
LAB_006b5065:
            __assert_fail("!Aig_IsComplement(pObj)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/ssw/sswInt.h"
                          ,0xb9,"Aig_Obj_t *Ssw_ObjChild0Fra(Ssw_Man_t *, Aig_Obj_t *, int)");
          }
          uVar5 = *(ulong *)((long)pvVar1 + 8) & 0xfffffffffffffffe;
          if (uVar5 == 0) {
            pAVar4 = (Aig_Obj_t *)0x0;
          }
          else {
            pAVar4 = (Aig_Obj_t *)
                     ((ulong)((uint)*(ulong *)((long)pvVar1 + 8) & 1) ^
                     (ulong)p->pNodeToFrames[*(int *)(uVar5 + 0x24) * p->nFrames + iVar2]);
          }
          p->pNodeToFrames[p->nFrames * *(int *)((long)pvVar1 + 0x24) + iVar2] = pAVar4;
          lVar14 = lVar14 + 1;
          pAVar3 = p->pAig;
          pVVar7 = pAVar3->vCos;
        } while (lVar14 < pVVar7->nSize);
      }
      iVar10 = iVar2 + 1;
      if (0 < pAVar3->nRegs) {
        iVar13 = 0;
        do {
          uVar6 = pAVar3->nTruePos + iVar13;
          if (((((int)uVar6 < 0) || (pAVar3->vCos->nSize <= (int)uVar6)) ||
              (uVar11 = pAVar3->nTruePis + iVar13, (int)uVar11 < 0)) ||
             (pAVar3->vCis->nSize <= (int)uVar11)) goto LAB_006b5046;
          pAVar4 = p->pNodeToFrames
                   [*(int *)((long)pAVar3->vCos->pArray[uVar6] + 0x24) * p->nFrames + iVar2];
          p->pNodeToFrames
          [p->nFrames * *(int *)((long)pAVar3->vCis->pArray[uVar11] + 0x24) + iVar10] = pAVar4;
          Ssw_CnfNodeAddToSolver(p->pMSat,(Aig_Obj_t *)((ulong)pAVar4 & 0xfffffffffffffffe));
          iVar13 = iVar13 + 1;
          pAVar3 = p->pAig;
        } while (iVar13 < pAVar3->nRegs);
      }
      pSVar8 = p->pPars;
      iVar2 = iVar10;
    } while (iVar10 < pSVar8->nFramesK);
  }
  if (pSVar8->fVerbose != 0) {
    Bar_ProgressStop(p_00);
  }
  iVar2 = clock_gettime(3,&local_40);
  if (iVar2 < 0) {
    lVar14 = -1;
  }
  else {
    lVar14 = local_40.tv_nsec / 1000 + local_40.tv_sec * 1000000;
  }
  p->timeBmc = p->timeBmc + lVar14 + lVar9;
  return p->fRefined;
}

Assistant:

int Ssw_ManSweepBmc( Ssw_Man_t * p )
{
    Bar_Progress_t * pProgress = NULL;
    Aig_Obj_t * pObj, * pObjNew, * pObjLi, * pObjLo;
    int i, f;
    abctime clk;
clk = Abc_Clock();

    // start initialized timeframes
    p->pFrames = Aig_ManStart( Aig_ManObjNumMax(p->pAig) * p->pPars->nFramesK );
    Saig_ManForEachLo( p->pAig, pObj, i )
        Ssw_ObjSetFrame( p, pObj, 0, Aig_ManConst0(p->pFrames) );

    // sweep internal nodes
    p->fRefined = 0;
    if ( p->pPars->fVerbose )
        pProgress = Bar_ProgressStart( stdout, Aig_ManObjNumMax(p->pAig) * p->pPars->nFramesK );
    for ( f = 0; f < p->pPars->nFramesK; f++ )
    {
        // map constants and PIs
        Ssw_ObjSetFrame( p, Aig_ManConst1(p->pAig), f, Aig_ManConst1(p->pFrames) );
        Saig_ManForEachPi( p->pAig, pObj, i )
            Ssw_ObjSetFrame( p, pObj, f, Aig_ObjCreateCi(p->pFrames) );
        // sweep flops
        Saig_ManForEachLo( p->pAig, pObj, i )
            p->fRefined |= Ssw_ManSweepNode( p, pObj, f, 1, NULL );
        // sweep internal nodes
        Aig_ManForEachNode( p->pAig, pObj, i )
        {
            if ( p->pPars->fVerbose )
                Bar_ProgressUpdate( pProgress, Aig_ManObjNumMax(p->pAig) * f + i, NULL );
            pObjNew = Aig_And( p->pFrames, Ssw_ObjChild0Fra(p, pObj, f), Ssw_ObjChild1Fra(p, pObj, f) );
            Ssw_ObjSetFrame( p, pObj, f, pObjNew );
            p->fRefined |= Ssw_ManSweepNode( p, pObj, f, 1, NULL );
        }
        // quit if this is the last timeframe
        if ( f == p->pPars->nFramesK - 1 )
            break;
        // transfer latch input to the latch outputs
        Aig_ManForEachCo( p->pAig, pObj, i )
            Ssw_ObjSetFrame( p, pObj, f, Ssw_ObjChild0Fra(p, pObj, f) );
        // build logic cones for register outputs
        Saig_ManForEachLiLo( p->pAig, pObjLi, pObjLo, i )
        {
            pObjNew = Ssw_ObjFrame( p, pObjLi, f );
            Ssw_ObjSetFrame( p, pObjLo, f+1, pObjNew );
            Ssw_CnfNodeAddToSolver( p->pMSat, Aig_Regular(pObjNew) );//
        }
    }
    if ( p->pPars->fVerbose )
        Bar_ProgressStop( pProgress );

    // cleanup
//    Ssw_ClassesCheck( p->ppClasses );
p->timeBmc += Abc_Clock() - clk;
    return p->fRefined;
}